

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_signal(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val;
  JSValue v_02;
  long lVar2;
  BOOL BVar3;
  int iVar4;
  JSRuntime *rt_00;
  JSThreadState *ts_00;
  JSOSSignalHandler *pJVar5;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar6;
  sighandler_t handler;
  JSValue func;
  uint32_t sig_num;
  JSOSSignalHandler *sh;
  JSThreadState *ts;
  JSRuntime *rt;
  JSOSSignalHandler *in_stack_ffffffffffffff78;
  JSContext *in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  JSValueUnion ctx_00;
  uint local_54;
  JSOSSignalHandler *local_50;
  JSValueUnion local_10;
  int64_t local_8;
  
  rt_00 = JS_GetRuntime(in_RDI);
  ts_00 = (JSThreadState *)JS_GetRuntimeOpaque(rt_00);
  BVar3 = is_main_thread((JSRuntime *)in_stack_ffffffffffffff80);
  if (BVar3 == 0) {
    _local_10 = JS_ThrowTypeError(in_RDI,"signal handler can only be set in the main thread");
  }
  else {
    JVar6.tag = in_stack_ffffffffffffff90;
    JVar6.u.float64 = in_stack_ffffffffffffff88.float64;
    iVar4 = JS_ToUint32(in_stack_ffffffffffffff80,(uint32_t *)in_stack_ffffffffffffff78,JVar6);
    lVar2 = local_10;
    if (iVar4 == 0) {
      if (local_54 < 0x40) {
        ctx_00 = (JSValueUnion)((JSValueUnion *)(in_R8 + 0x10))->ptr;
        iVar1 = *(int64_t *)(in_R8 + 0x18);
        iVar4 = JS_IsNull(*(JSValue *)(in_R8 + 0x10));
        if ((iVar4 == 0) &&
           (v_00.tag = iVar1, v_00.u.ptr = ctx_00.ptr, iVar4 = JS_IsUndefined(v_00), iVar4 == 0)) {
          val.tag = iVar1;
          val.u.ptr = ctx_00.ptr;
          iVar4 = JS_IsFunction(in_RDI,val);
          if (iVar4 == 0) {
            JVar6 = JS_ThrowTypeError(in_RDI,"not a function");
            return JVar6;
          }
          local_50 = find_sh(ts_00,local_54);
          if (local_50 == (JSOSSignalHandler *)0x0) {
            local_50 = (JSOSSignalHandler *)
                       js_mallocz((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff90);
            if (local_50 == (JSOSSignalHandler *)0x0) {
              local_10.ptr = (void *)(lVar2 << 0x20);
              local_8 = 6;
              return _local_10;
            }
            local_50->sig_num = local_54;
            list_add_tail((list_head *)in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->link);
          }
          v.tag = in_stack_ffffffffffffff90;
          v.u.float64 = in_stack_ffffffffffffff88.float64;
          JS_FreeValue(in_stack_ffffffffffffff80,v);
          v_02.tag = iVar1;
          v_02.u.ptr = ctx_00.ptr;
          JVar6 = JS_DupValue(in_RDI,v_02);
          (local_50->func).u = JVar6.u;
          (local_50->func).tag = JVar6.tag;
          signal(local_54,os_signal_handler);
        }
        else {
          pJVar5 = find_sh(ts_00,local_54);
          if (pJVar5 != (JSOSSignalHandler *)0x0) {
            JS_GetRuntime(in_RDI);
            free_sh((JSRuntime *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          }
          v_01.tag = iVar1;
          v_01.u.ptr = ctx_00.ptr;
          iVar4 = JS_IsNull(v_01);
          signal(local_54,(__sighandler_t)(ulong)(iVar4 == 0));
        }
        local_10.ptr = (void *)(lVar2 << 0x20);
        local_8 = 3;
      }
      else {
        _local_10 = JS_ThrowRangeError(in_RDI,"invalid signal number");
      }
    }
    else {
      local_10.ptr = (void *)(lVar2 << 0x20);
      local_8 = 6;
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_os_signal(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    JSOSSignalHandler *sh;
    uint32_t sig_num;
    JSValueConst func;
    sighandler_t handler;

    if (!is_main_thread(rt))
        return JS_ThrowTypeError(ctx, "signal handler can only be set in the main thread");
    
    if (JS_ToUint32(ctx, &sig_num, argv[0]))
        return JS_EXCEPTION;
    if (sig_num >= 64)
        return JS_ThrowRangeError(ctx, "invalid signal number");
    func = argv[1];
    /* func = null: SIG_DFL, func = undefined, SIG_IGN */
    if (JS_IsNull(func) || JS_IsUndefined(func)) {
        sh = find_sh(ts, sig_num);
        if (sh) {
            free_sh(JS_GetRuntime(ctx), sh);
        }
        if (JS_IsNull(func))
            handler = SIG_DFL;
        else
            handler = SIG_IGN;
        signal(sig_num, handler);
    } else {
        if (!JS_IsFunction(ctx, func))
            return JS_ThrowTypeError(ctx, "not a function");
        sh = find_sh(ts, sig_num);
        if (!sh) {
            sh = js_mallocz(ctx, sizeof(*sh));
            if (!sh)
                return JS_EXCEPTION;
            sh->sig_num = sig_num;
            list_add_tail(&sh->link, &ts->os_signal_handlers);
        }
        JS_FreeValue(ctx, sh->func);
        sh->func = JS_DupValue(ctx, func);
        signal(sig_num, os_signal_handler);
    }
    return JS_UNDEFINED;
}